

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint16_t *puVar7;
  BrotliDictionary *pBVar8;
  undefined8 uVar9;
  int iVar10;
  size_t sVar11;
  uint32_t uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  uint8_t *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint16_t uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  int last_distance;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ushort uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  bool bVar49;
  ulong local_168;
  ulong local_160;
  uint local_150;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  size_t local_110;
  ulong local_100;
  ulong local_f0;
  ulong local_d8;
  Command *local_d0;
  int local_bc;
  
  uVar14 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar4 = (position - 3) + num_bytes;
  sVar20 = position;
  if (3 < num_bytes) {
    sVar20 = uVar4;
  }
  lVar21 = 0x200;
  if (params->quality < 9) {
    lVar21 = 0x40;
  }
  local_110 = *last_insert_len;
  uVar1 = position + num_bytes;
  iVar41 = (int)*(undefined8 *)dist_cache;
  iVar42 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  dist_cache[4] = iVar41 + -1;
  dist_cache[5] = iVar41 + 1;
  dist_cache[6] = iVar41 + -2;
  dist_cache[7] = iVar41 + 2;
  dist_cache[8] = iVar41 + -3;
  dist_cache[9] = iVar41 + 3;
  dist_cache[10] = iVar42 + -1;
  dist_cache[0xb] = iVar42 + 1;
  dist_cache[0xc] = iVar42 + -2;
  dist_cache[0xd] = iVar42 + 2;
  dist_cache[0xe] = iVar42 + -3;
  dist_cache[0xf] = iVar42 + 3;
  uVar5 = (position - 4) + num_bytes;
  lVar3 = position - 1;
  uVar44 = lVar21 + position;
  local_d0 = commands;
LAB_0010894d:
LAB_0010895a:
  uVar18 = position;
  if (uVar1 <= uVar18 + 4) {
    *last_insert_len = (local_110 + uVar1) - uVar18;
    *num_commands = *num_commands + ((long)local_d0 - (long)commands >> 4);
    return;
  }
  local_d8 = uVar1 - uVar18;
  uVar38 = uVar14;
  if (uVar18 < uVar14) {
    uVar38 = uVar18;
  }
  uVar43 = (params->dist).max_distance;
  uVar30 = uVar18 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar30);
  uVar40 = (uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0x11;
  uVar39 = (ulong)uVar40;
  uVar35 = (ulong)((uint)local_d8 & 7);
  uVar33 = 0x7e4;
  uVar34 = 0;
  uVar46 = 0;
  lVar48 = 0;
  local_168 = 0;
  do {
    if (lVar48 == 0x10) {
      uVar45 = uVar40 & 0x1ff;
      lVar48 = *(long *)(hasher + 0x140428);
      uVar31 = uVar18 - *(uint *)(hasher + uVar39 * 4 + 0x28);
      uVar6 = *(ushort *)(hasher + uVar39 * 2 + 0x20028);
      uVar26 = (ulong)(uVar45 << 0xb);
      uVar22 = 0;
      lVar37 = lVar48;
      uVar15 = uVar31;
      uVar36 = uVar6;
      do {
        uVar25 = uVar46;
        uVar47 = local_168;
        local_120 = uVar34;
        uVar17 = uVar33;
        uVar16 = uVar30 + uVar47;
        do {
          do {
            do {
              do {
                bVar49 = lVar37 == 0;
                lVar37 = lVar37 + -1;
                if ((bVar49) || (uVar22 = uVar22 + uVar15, uVar38 < uVar22)) {
                  uVar36 = *(ushort *)(hasher + (ulong)uVar45 * 2 + 0x140028);
                  *(ushort *)(hasher + (ulong)uVar45 * 2 + 0x140028) = uVar36 + 1;
                  uVar45 = uVar36 & 0x1ff;
                  if (0xfffe < uVar31) {
                    uVar31 = 0xffff;
                  }
                  hasher[(uVar18 & 0xffff) + 0x30028] = (uint8_t)uVar40;
                  *(short *)(hasher + (ulong)uVar45 * 4 + uVar26 + 0x40028) = (short)uVar31;
                  *(ushort *)(hasher + (ulong)uVar45 * 4 + uVar26 + 0x4002a) = uVar6;
                  *(int *)(hasher + uVar39 * 4 + 0x28) = (int)uVar18;
                  *(short *)(hasher + uVar39 * 2 + 0x20028) = (short)uVar45;
                  if (uVar17 != 0x7e4) {
                    iVar41 = 0;
                    goto LAB_00108fb0;
                  }
                  uVar33 = *(ulong *)(hasher + 0x18);
                  local_118 = *(ulong *)(hasher + 0x20);
                  if (local_118 < uVar33 >> 7) goto LAB_00108fbc;
                  uVar34 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar7 = (params->dictionary).hash_table;
                  iVar41 = 0;
                  uVar17 = 0x7e4;
                  lVar37 = 0;
                  goto LAB_00108d92;
                }
                uVar33 = (ulong)uVar36;
                uVar36 = *(ushort *)(hasher + uVar33 * 4 + uVar26 + 0x4002a);
                uVar15 = (ulong)*(ushort *)(hasher + uVar33 * 4 + uVar26 + 0x40028);
              } while (ringbuffer_mask < uVar16);
              uVar34 = uVar18 - uVar22 & ringbuffer_mask;
              uVar33 = uVar47 + uVar34;
            } while ((ringbuffer_mask < uVar33) || (ringbuffer[uVar16] != ringbuffer[uVar33]));
            uVar33 = 0;
            lVar23 = 0;
LAB_00108bfa:
            uVar46 = uVar35;
            uVar27 = local_d8 & 0xfffffffffffffff8;
            if (local_d8 >> 3 == uVar33) {
              for (; (local_168 = local_d8, uVar46 != 0 &&
                     (local_168 = uVar27,
                     ringbuffer[uVar27 + uVar34] == *(uint8_t *)((long)piVar2 + uVar27)));
                  uVar27 = uVar27 + 1) {
                uVar46 = uVar46 - 1;
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar34))
              goto code_r0x00108c11;
              uVar34 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar34) ^
                       *(ulong *)(piVar2 + uVar33 * 2);
              uVar33 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              local_168 = (uVar33 >> 3 & 0x1fffffff) - lVar23;
            }
          } while (local_168 < 4);
          iVar41 = 0x1f;
          if ((uint)uVar22 != 0) {
            for (; (uint)uVar22 >> iVar41 == 0; iVar41 = iVar41 + -1) {
            }
          }
          uVar33 = (ulong)(iVar41 * -0x1e + 0x780) + local_168 * 0x87;
          uVar34 = uVar22;
          uVar46 = local_168;
        } while (uVar33 <= uVar17);
      } while( true );
    }
    uVar15 = (ulong)dist_cache[lVar48];
    uVar22 = uVar18 - uVar15;
    if ((((lVar48 == 0) || (hasher[(uVar22 & 0xffff) + 0x30028] == (uint8_t)uVar40)) &&
        (uVar15 <= uVar38)) && (uVar22 < uVar18)) {
      uVar31 = 0;
      lVar37 = 0;
LAB_00108a32:
      uVar26 = local_d8 & 0xfffffffffffffff8;
      uVar17 = uVar35;
      if (local_d8 >> 3 == uVar31) {
        for (; (uVar31 = local_d8, uVar17 != 0 &&
               (uVar31 = uVar26,
               ringbuffer[uVar26 + (uVar22 & ringbuffer_mask)] ==
               *(uint8_t *)((long)piVar2 + uVar26))); uVar26 = uVar26 + 1) {
          uVar17 = uVar17 - 1;
        }
      }
      else {
        if (*(ulong *)(piVar2 + uVar31 * 2) ==
            *(ulong *)(ringbuffer + uVar31 * 8 + (uVar22 & ringbuffer_mask))) goto code_r0x00108a4d;
        uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + (uVar22 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar31 * 2);
        uVar22 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar31 = (uVar22 >> 3 & 0x1fffffff) - lVar37;
      }
      if ((1 < uVar31) && (uVar22 = uVar31 * 0x87 + 0x78f, uVar33 < uVar22)) {
        if (lVar48 != 0) {
          uVar22 = uVar22 - ((0x1ca10U >> ((byte)lVar48 & 0xe) & 0xe) + 0x27);
        }
        if (uVar33 < uVar22) {
          uVar33 = uVar22;
          uVar34 = uVar15;
          uVar46 = uVar31;
          local_168 = uVar31;
        }
      }
    }
    lVar48 = lVar48 + 1;
  } while( true );
LAB_00108d92:
  if (lVar37 == 2) goto LAB_00108fb0;
  uVar6 = puVar7[uVar34];
  uVar33 = uVar33 + 1;
  *(ulong *)(hasher + 0x18) = uVar33;
  if (uVar6 != 0) {
    uVar40 = uVar6 & 0x1f;
    uVar46 = (ulong)uVar40;
    if (uVar46 <= local_d8) {
      pBVar8 = (params->dictionary).words;
      lVar23 = (ulong)pBVar8->offsets_by_length[uVar46] + uVar46 * (uVar6 >> 5);
      uVar30 = (ulong)(uVar6 & 0x18);
      uVar35 = 0;
LAB_00108e0c:
      if ((uVar6 & 0x18) == uVar35) {
        uVar39 = (ulong)(uVar6 & 7);
        puVar24 = pBVar8->data + uVar35 + lVar23;
        for (; (bVar49 = uVar39 != 0, uVar39 = uVar39 - 1, uVar35 = (ulong)(uVar6 & 0x1f), bVar49 &&
               (uVar35 = uVar30, *(uint8_t *)((long)piVar2 + uVar30) == *puVar24));
            uVar30 = uVar30 + 1) {
          puVar24 = puVar24 + 1;
        }
      }
      else {
        uVar39 = *(ulong *)(pBVar8->data + uVar35 + lVar23);
        if (uVar39 == *(ulong *)((long)piVar2 + uVar35)) goto code_r0x00108e2a;
        uVar39 = *(ulong *)((long)piVar2 + uVar35) ^ uVar39;
        uVar30 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar35 = (uVar30 >> 3 & 0x1fffffff) + uVar35;
      }
      if (((uVar35 != 0) && (uVar46 < (params->dictionary).cutoffTransformsCount + uVar35)) &&
         (uVar46 = (ulong)(uVar6 >> 5) + uVar38 + 1 +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar46 - uVar35) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar46 - uVar35) * 4 << (pBVar8->size_bits_by_length[uVar46] & 0x3f)),
         uVar46 <= uVar43)) {
        iVar42 = 0x1f;
        if ((uint)uVar46 != 0) {
          for (; (uint)uVar46 >> iVar42 == 0; iVar42 = iVar42 + -1) {
          }
        }
        uVar30 = (uVar35 * 0x87 - (ulong)(uint)(iVar42 * 0x1e)) + 0x780;
        if (uVar17 <= uVar30) {
          iVar41 = uVar40 - (int)uVar35;
          local_118 = local_118 + 1;
          *(ulong *)(hasher + 0x20) = local_118;
          uVar17 = uVar30;
          local_120 = uVar46;
          uVar25 = uVar35;
        }
      }
    }
  }
  lVar37 = lVar37 + 1;
  uVar34 = uVar34 + 1;
  goto LAB_00108d92;
LAB_00108fb0:
  if (uVar17 < 0x7e5) {
LAB_00108fbc:
    local_110 = local_110 + 1;
    position = uVar18 + 1;
    if (uVar44 < position) {
      if (uVar44 + (uint)((int)lVar21 * 4) < position) {
        uVar38 = uVar18 + 0x11;
        if (uVar5 <= uVar18 + 0x11) {
          uVar38 = uVar5;
        }
        for (; position < uVar38; position = position + 4) {
          uVar40 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar18 = (ulong)uVar40;
          uVar29 = uVar40 & 0x1ff;
          uVar6 = *(ushort *)(hasher + (ulong)uVar29 * 2 + 0x140028);
          *(ushort *)(hasher + (ulong)uVar29 * 2 + 0x140028) = uVar6 + 1;
          uVar45 = uVar6 & 0x1ff;
          uVar43 = position - *(uint *)(hasher + uVar18 * 4 + 0x28);
          hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar40;
          if (0xfffe < uVar43) {
            uVar43 = 0xffff;
          }
          *(short *)(hasher + (ulong)uVar45 * 4 + (ulong)(uVar29 << 0xb) + 0x40028) = (short)uVar43;
          *(undefined2 *)(hasher + (ulong)uVar45 * 4 + (ulong)(uVar29 << 0xb) + 0x4002a) =
               *(undefined2 *)(hasher + uVar18 * 2 + 0x20028);
          *(int *)(hasher + uVar18 * 4 + 0x28) = (int)position;
          *(short *)(hasher + uVar18 * 2 + 0x20028) = (short)uVar45;
          local_110 = local_110 + 4;
        }
      }
      else {
        uVar38 = uVar18 + 9;
        if (uVar4 <= uVar18 + 9) {
          uVar38 = uVar4;
        }
        for (; position < uVar38; position = position + 2) {
          uVar40 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar18 = (ulong)uVar40;
          uVar29 = uVar40 & 0x1ff;
          uVar6 = *(ushort *)(hasher + (ulong)uVar29 * 2 + 0x140028);
          *(ushort *)(hasher + (ulong)uVar29 * 2 + 0x140028) = uVar6 + 1;
          uVar45 = uVar6 & 0x1ff;
          uVar43 = position - *(uint *)(hasher + uVar18 * 4 + 0x28);
          hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar40;
          if (0xfffe < uVar43) {
            uVar43 = 0xffff;
          }
          *(short *)(hasher + (ulong)uVar45 * 4 + (ulong)(uVar29 << 0xb) + 0x40028) = (short)uVar43;
          *(undefined2 *)(hasher + (ulong)uVar45 * 4 + (ulong)(uVar29 << 0xb) + 0x4002a) =
               *(undefined2 *)(hasher + uVar18 * 2 + 0x20028);
          *(int *)(hasher + uVar18 * 4 + 0x28) = (int)position;
          *(short *)(hasher + uVar18 * 2 + 0x20028) = (short)uVar45;
          local_110 = local_110 + 2;
        }
      }
    }
    goto LAB_0010895a;
  }
  uVar44 = local_110 + 4;
  uVar38 = (lVar3 + num_bytes) - uVar18;
  local_bc = 0;
LAB_00109164:
  uVar43 = (ulong)((uint)uVar38 & 7);
  local_d8 = local_d8 - 1;
  local_128 = uVar25 - 1;
  if (local_d8 <= uVar25 - 1) {
    local_128 = local_d8;
  }
  if (4 < params->quality) {
    local_128 = 0;
  }
  uVar33 = uVar18 + 1;
  local_100 = uVar14;
  if (uVar33 < uVar14) {
    local_100 = uVar33;
  }
  uVar34 = (params->dist).max_distance;
  uVar30 = uVar33 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar30);
  uVar40 = (uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0x11;
  uVar35 = 0x7e4;
  uVar46 = 0;
  local_160 = 0;
  lVar37 = 0;
  do {
    if (lVar37 == 0x10) {
      uVar26 = (ulong)uVar40;
      uVar45 = uVar40 & 0x1ff;
      uVar47 = uVar33 - *(uint *)(hasher + uVar26 * 4 + 0x28);
      uVar6 = *(ushort *)(hasher + uVar26 * 2 + 0x20028);
      uVar16 = (ulong)(uVar45 << 0xb);
      uVar31 = 0;
      lVar37 = lVar48;
      uVar39 = local_160;
      uVar15 = uVar47;
      uVar36 = uVar6;
      uVar22 = local_128;
      do {
        local_128 = uVar22;
        uVar27 = uVar35;
        uVar32 = uVar39;
        local_160 = uVar46;
        do {
          do {
            do {
              do {
                bVar49 = lVar37 == 0;
                lVar37 = lVar37 + -1;
                if ((bVar49) || (uVar31 = uVar31 + uVar15, local_100 < uVar31)) {
                  uVar36 = *(ushort *)(hasher + (ulong)uVar45 * 2 + 0x140028);
                  *(ushort *)(hasher + (ulong)uVar45 * 2 + 0x140028) = uVar36 + 1;
                  uVar45 = uVar36 & 0x1ff;
                  if (0xfffe < uVar47) {
                    uVar47 = 0xffff;
                  }
                  hasher[(uVar33 & 0xffff) + 0x30028] = (uint8_t)uVar40;
                  *(short *)(hasher + (ulong)uVar45 * 4 + uVar16 + 0x40028) = (short)uVar47;
                  *(ushort *)(hasher + (ulong)uVar45 * 4 + uVar16 + 0x4002a) = uVar6;
                  *(int *)(hasher + uVar26 * 4 + 0x28) = (int)uVar33;
                  *(short *)(hasher + uVar26 * 2 + 0x20028) = (short)uVar45;
                  iVar42 = 0;
                  if (uVar27 != 0x7e4) goto LAB_001097f8;
                  uVar43 = *(ulong *)(hasher + 0x18);
                  local_f0 = *(ulong *)(hasher + 0x20);
                  uVar27 = 0x7e4;
                  if (local_f0 < uVar43 >> 7) goto LAB_001097f8;
                  uVar46 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar7 = (params->dictionary).hash_table;
                  iVar42 = 0;
                  lVar37 = 0;
                  goto LAB_001095d9;
                }
                uVar46 = (ulong)uVar36;
                uVar36 = *(ushort *)(hasher + uVar46 * 4 + uVar16 + 0x4002a);
                uVar15 = (ulong)*(ushort *)(hasher + uVar46 * 4 + uVar16 + 0x40028);
              } while (ringbuffer_mask < local_128 + uVar30);
              uVar46 = uVar33 - uVar31 & ringbuffer_mask;
            } while ((ringbuffer_mask < uVar46 + local_128) ||
                    (ringbuffer[local_128 + uVar30] != ringbuffer[uVar46 + local_128]));
            uVar35 = 0;
            lVar23 = 0;
LAB_00109409:
            if (uVar38 >> 3 == uVar35) {
              uVar35 = uVar43;
              for (uVar39 = -lVar23;
                  (bVar49 = uVar35 != 0, uVar35 = uVar35 - 1, bVar49 &&
                  (ringbuffer[uVar39 + uVar46] == *(uint8_t *)((long)piVar2 + uVar39)));
                  uVar39 = uVar39 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar35 * 2) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar46))
              goto code_r0x00109422;
              uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar46) ^
                       *(ulong *)(piVar2 + uVar35 * 2);
              uVar46 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              uVar39 = (uVar46 >> 3 & 0x1fffffff) - lVar23;
            }
          } while (uVar39 < 4);
          iVar42 = 0x1f;
          if ((uint)uVar31 != 0) {
            for (; (uint)uVar31 >> iVar42 == 0; iVar42 = iVar42 + -1) {
            }
          }
          uVar35 = (ulong)(iVar42 * -0x1e + 0x780) + uVar39 * 0x87;
          uVar46 = uVar31;
          uVar22 = uVar39;
        } while (uVar35 <= uVar27);
      } while( true );
    }
    uVar39 = (ulong)dist_cache[lVar37];
    uVar15 = uVar33 - uVar39;
    if ((((lVar37 == 0) || (hasher[(uVar15 & 0xffff) + 0x30028] == (uint8_t)uVar40)) &&
        (uVar39 <= local_100)) && (uVar15 < uVar33)) {
      uVar22 = 0;
      lVar23 = 0;
LAB_00109252:
      if (uVar38 >> 3 == uVar22) {
        uVar31 = uVar43;
        for (uVar22 = -lVar23;
            (bVar49 = uVar31 != 0, uVar31 = uVar31 - 1, bVar49 &&
            (ringbuffer[uVar22 + (uVar15 & ringbuffer_mask)] == *(uint8_t *)((long)piVar2 + uVar22))
            ); uVar22 = uVar22 + 1) {
        }
      }
      else {
        if (*(ulong *)(piVar2 + uVar22 * 2) ==
            *(ulong *)(ringbuffer + uVar22 * 8 + (uVar15 & ringbuffer_mask))) goto code_r0x0010926f;
        uVar22 = *(ulong *)(ringbuffer + uVar22 * 8 + (uVar15 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar22 * 2);
        uVar15 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar22 = (uVar15 >> 3 & 0x1fffffff) - lVar23;
      }
      if ((1 < uVar22) && (uVar15 = uVar22 * 0x87 + 0x78f, uVar35 < uVar15)) {
        if (lVar37 != 0) {
          uVar15 = uVar15 - ((0x1ca10U >> ((byte)lVar37 & 0xe) & 0xe) + 0x27);
        }
        if (uVar35 < uVar15) {
          uVar46 = uVar39;
          uVar35 = uVar15;
          local_160 = uVar22;
          local_128 = uVar22;
        }
      }
    }
    lVar37 = lVar37 + 1;
  } while( true );
LAB_001095d9:
  if (lVar37 == 2) goto LAB_001097f8;
  uVar6 = puVar7[uVar46];
  uVar43 = uVar43 + 1;
  *(ulong *)(hasher + 0x18) = uVar43;
  if (uVar6 != 0) {
    uVar40 = uVar6 & 0x1f;
    uVar35 = (ulong)uVar40;
    if (uVar35 <= local_d8) {
      pBVar8 = (params->dictionary).words;
      lVar23 = (ulong)pBVar8->offsets_by_length[uVar35] + uVar35 * (uVar6 >> 5);
      uVar45 = (uint)uVar6;
      uVar30 = (ulong)(uVar45 & 0x18);
      uVar39 = 0;
LAB_00109662:
      if ((uVar6 & 0x18) == uVar39) {
        uVar15 = (ulong)(uVar45 & 7);
        puVar24 = pBVar8->data + uVar39 + lVar23;
        for (; (bVar49 = uVar15 != 0, uVar15 = uVar15 - 1, uVar39 = (ulong)(uVar45 & 0x1f), bVar49
               && (uVar39 = uVar30, *(uint8_t *)((long)piVar2 + uVar30) == *puVar24));
            uVar30 = uVar30 + 1) {
          puVar24 = puVar24 + 1;
        }
      }
      else {
        uVar15 = *(ulong *)(pBVar8->data + uVar39 + lVar23);
        if (uVar15 == *(ulong *)((long)piVar2 + uVar39)) goto code_r0x0010967d;
        uVar15 = *(ulong *)((long)piVar2 + uVar39) ^ uVar15;
        uVar30 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar39 = (uVar30 >> 3 & 0x1fffffff) + uVar39;
      }
      if (((uVar39 != 0) && (uVar35 < (params->dictionary).cutoffTransformsCount + uVar39)) &&
         (uVar35 = (ulong)(uVar6 >> 5) + local_100 + 1 +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar35 - uVar39) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar35 - uVar39) * 4 << (pBVar8->size_bits_by_length[uVar35] & 0x3f)),
         uVar35 <= uVar34)) {
        iVar10 = 0x1f;
        if ((uint)uVar35 != 0) {
          for (; (uint)uVar35 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        uVar30 = (uVar39 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
        if (uVar27 <= uVar30) {
          iVar42 = uVar40 - (int)uVar39;
          local_f0 = local_f0 + 1;
          *(ulong *)(hasher + 0x20) = local_f0;
          uVar27 = uVar30;
          uVar32 = uVar39;
          local_160 = uVar35;
        }
      }
    }
  }
  lVar37 = lVar37 + 1;
  uVar46 = uVar46 + 1;
  goto LAB_001095d9;
LAB_001097f8:
  if (uVar27 < uVar17 + 0xaf) {
    uVar32 = uVar25;
    uVar33 = uVar18;
    sVar11 = local_110;
    local_100 = uVar14;
    iVar42 = iVar41;
    if (uVar18 < uVar14) {
      local_100 = uVar18;
    }
    goto LAB_00109896;
  }
  local_120 = local_160;
  sVar11 = uVar44;
  if (local_bc == 3) goto LAB_00109896;
  local_110 = local_110 + 1;
  local_bc = local_bc + 1;
  uVar43 = uVar18 + 5;
  uVar38 = uVar38 - 1;
  uVar17 = uVar27;
  uVar25 = uVar32;
  uVar18 = uVar33;
  sVar11 = local_110;
  iVar41 = iVar42;
  if (uVar1 <= uVar43) goto LAB_00109896;
  goto LAB_00109164;
LAB_00109896:
  local_110 = sVar11;
  if (local_100 < local_120) {
LAB_001098a8:
    uVar44 = local_120 + 0xf;
  }
  else {
    if (local_120 == (long)*dist_cache) {
      uVar44 = 0;
      goto LAB_00109934;
    }
    uVar44 = 1;
    if (local_120 != (long)dist_cache[1]) {
      uVar44 = (local_120 + 3) - (long)*dist_cache;
      if (uVar44 < 7) {
        bVar19 = (byte)((int)uVar44 << 2);
        uVar40 = 0x9750468;
      }
      else {
        uVar44 = (local_120 + 3) - (long)dist_cache[1];
        if (6 < uVar44) {
          uVar44 = 2;
          if ((local_120 != (long)dist_cache[2]) && (uVar44 = 3, local_120 != (long)dist_cache[3]))
          goto LAB_001098a8;
          goto LAB_001098ac;
        }
        bVar19 = (byte)((int)uVar44 << 2);
        uVar40 = 0xfdb1ace;
      }
      uVar44 = (ulong)(uVar40 >> (bVar19 & 0x1f) & 0xf);
    }
  }
LAB_001098ac:
  if ((local_120 <= local_100) && (uVar44 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar9 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar9;
    iVar41 = (int)local_120;
    *dist_cache = iVar41;
    dist_cache[4] = iVar41 + -1;
    dist_cache[5] = iVar41 + 1;
    dist_cache[6] = iVar41 + -2;
    dist_cache[7] = iVar41 + 2;
    dist_cache[8] = iVar41 + -3;
    dist_cache[9] = iVar41 + 3;
    iVar41 = (int)uVar9;
    dist_cache[10] = iVar41 + -1;
    dist_cache[0xb] = iVar41 + 1;
    dist_cache[0xc] = iVar41 + -2;
    dist_cache[0xd] = iVar41 + 2;
    *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar41 + 3,iVar41 + -3);
  }
LAB_00109934:
  uVar40 = (uint)local_110;
  local_d0->insert_len_ = uVar40;
  local_150 = (uint)uVar32;
  local_d0->copy_len_ = iVar42 << 0x19 | local_150;
  uVar38 = (ulong)(params->dist).num_direct_distance_codes;
  uVar18 = uVar38 + 0x10;
  uVar12 = 0;
  if (uVar18 <= uVar44) {
    uVar45 = (params->dist).distance_postfix_bits;
    bVar19 = (byte)uVar45;
    uVar38 = ((4L << (bVar19 & 0x3f)) + (uVar44 - uVar38)) - 0x10;
    uVar29 = 0x1f;
    uVar13 = (uint)uVar38;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar29 = (uVar29 ^ 0xffffffe0) + 0x1f;
    uVar43 = (ulong)((uVar38 >> ((ulong)uVar29 & 0x3f) & 1) != 0);
    lVar48 = (ulong)uVar29 - (ulong)uVar45;
    uVar44 = (~(-1 << (bVar19 & 0x1f)) & uVar13) + uVar18 +
             (uVar43 + lVar48 * 2 + 0xfffe << (bVar19 & 0x3f)) | lVar48 * 0x400;
    uVar12 = (uint32_t)(uVar38 - (uVar43 + 2 << ((byte)uVar29 & 0x3f)) >> (bVar19 & 0x3f));
  }
  local_d0->dist_prefix_ = (uint16_t)uVar44;
  local_d0->dist_extra_ = uVar12;
  if (5 < local_110) {
    if (local_110 < 0x82) {
      uVar40 = 0x1f;
      uVar45 = (uint)(local_110 - 2);
      if (uVar45 != 0) {
        for (; uVar45 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar40 = (int)(local_110 - 2 >> ((char)(uVar40 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar40 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_110 < 0x842) {
      uVar45 = 0x1f;
      if (uVar40 - 0x42 != 0) {
        for (; uVar40 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar40 = (uVar45 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar40 = 0x15;
      if (0x1841 < local_110) {
        uVar40 = (uint)(ushort)(0x17 - (local_110 < 0x5842));
      }
    }
  }
  local_150 = iVar42 + local_150;
  if (local_150 < 10) {
    uVar45 = local_150 - 2;
  }
  else if (local_150 < 0x86) {
    local_150 = local_150 - 6;
    uVar45 = 0x1f;
    if (local_150 != 0) {
      for (; local_150 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (local_150 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar45 ^ 0xffffffe0) * 2
             + 0x42;
  }
  else {
    uVar45 = 0x17;
    if (local_150 < 0x846) {
      uVar45 = 0x1f;
      if (local_150 - 0x46 != 0) {
        for (; local_150 - 0x46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar45 = (uVar45 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar45;
  uVar28 = (uVar6 & 7) + ((ushort)uVar40 & 7) * 8;
  if ((((uVar44 & 0x3ff) == 0) && ((ushort)uVar40 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar28 = uVar28 + 0x40;
    }
  }
  else {
    iVar41 = ((uVar40 & 0xffff) >> 3) * 3 + ((uVar45 & 0xffff) >> 3);
    uVar28 = uVar28 + ((ushort)(0x520d40 >> ((char)iVar41 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar41 * 0x40 + 0x40;
  }
  local_d0->cmd_prefix_ = uVar28;
  *num_literals = *num_literals + local_110;
  position = uVar32 + uVar33;
  uVar18 = sVar20;
  if (position < sVar20) {
    uVar18 = position;
  }
  uVar38 = uVar33 + 2;
  if (local_120 < uVar32 >> 2) {
    uVar44 = position + local_120 * -4;
    if (uVar44 < uVar38) {
      uVar44 = uVar38;
    }
    uVar38 = uVar44;
    if (uVar18 < uVar44) {
      uVar38 = uVar18;
    }
  }
  uVar44 = uVar33 + lVar21 + uVar32 * 2;
  local_d0 = local_d0 + 1;
  for (; uVar38 < uVar18; uVar38 = uVar38 + 1) {
    uVar40 = (uint)(*(int *)(ringbuffer + (uVar38 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar43 = (ulong)uVar40;
    uVar45 = uVar40 & 0x1ff;
    uVar6 = *(ushort *)(hasher + (ulong)uVar45 * 2 + 0x140028);
    *(ushort *)(hasher + (ulong)uVar45 * 2 + 0x140028) = uVar6 + 1;
    uVar29 = uVar6 & 0x1ff;
    uVar33 = uVar38 - *(uint *)(hasher + uVar43 * 4 + 0x28);
    hasher[(uVar38 & 0xffff) + 0x30028] = (uint8_t)uVar40;
    if (0xfffe < uVar33) {
      uVar33 = 0xffff;
    }
    *(short *)(hasher + (ulong)uVar29 * 4 + (ulong)(uVar45 << 0xb) + 0x40028) = (short)uVar33;
    *(undefined2 *)(hasher + (ulong)uVar29 * 4 + (ulong)(uVar45 << 0xb) + 0x4002a) =
         *(undefined2 *)(hasher + uVar43 * 2 + 0x20028);
    *(int *)(hasher + uVar43 * 4 + 0x28) = (int)uVar38;
    *(short *)(hasher + uVar43 * 2 + 0x20028) = (short)uVar29;
  }
  local_110 = 0;
  goto LAB_0010894d;
code_r0x0010967d:
  uVar39 = uVar39 + 8;
  goto LAB_00109662;
code_r0x00109422:
  lVar23 = lVar23 + -8;
  uVar35 = uVar35 + 1;
  goto LAB_00109409;
code_r0x0010926f:
  lVar23 = lVar23 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_00109252;
code_r0x00108e2a:
  uVar35 = uVar35 + 8;
  goto LAB_00108e0c;
code_r0x00108c11:
  lVar23 = lVar23 + -8;
  uVar33 = uVar33 + 1;
  goto LAB_00108bfa;
code_r0x00108a4d:
  lVar37 = lVar37 + -8;
  uVar31 = uVar31 + 1;
  goto LAB_00108a32;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}